

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

void __thiscall Assimp::Importer::GetExtensionList(Importer *this,aiString *szOut)

{
  bool bVar1;
  reference ppBVar2;
  char *app;
  _Self *__x;
  _Self local_80;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  const_iterator it;
  __normal_iterator<Assimp::BaseImporter_**,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
  local_60;
  __normal_iterator<Assimp::BaseImporter_**,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
  local_58;
  __normal_iterator<Assimp::BaseImporter_*const_*,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
  local_50;
  const_iterator i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str;
  aiString *szOut_local;
  Importer *this_local;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&i);
  local_58._M_current =
       (BaseImporter **)
       std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::begin
                 (&this->pimpl->mImporter);
  __gnu_cxx::
  __normal_iterator<Assimp::BaseImporter*const*,std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>>
  ::__normal_iterator<Assimp::BaseImporter**>
            ((__normal_iterator<Assimp::BaseImporter*const*,std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>>
              *)&local_50,&local_58);
  while( true ) {
    local_60._M_current =
         (BaseImporter **)
         std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::end
                   (&this->pimpl->mImporter);
    bVar1 = __gnu_cxx::operator!=(&local_50,&local_60);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<Assimp::BaseImporter_*const_*,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
              ::operator*(&local_50);
    BaseImporter::GetExtensionList
              (*ppBVar2,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&i);
    __gnu_cxx::
    __normal_iterator<Assimp::BaseImporter_*const_*,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
    ::operator++(&local_50);
  }
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i);
  if (!bVar1) {
    local_78._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
    while( true ) {
      aiString::Append(szOut,"*.");
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_78);
      app = (char *)std::__cxx11::string::c_str();
      aiString::Append(szOut,app);
      __x = std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&local_78);
      local_80._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
      bVar1 = std::operator==(__x,&local_80);
      if (bVar1) break;
      aiString::Append(szOut,";");
    }
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&i);
  return;
}

Assistant:

void Importer::GetExtensionList(aiString& szOut) const
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    std::set<std::string> str;
    for (std::vector<BaseImporter*>::const_iterator i =  pimpl->mImporter.begin();i != pimpl->mImporter.end();++i)  {
        (*i)->GetExtensionList(str);
    }

	// List can be empty
	if( !str.empty() ) {
		for (std::set<std::string>::const_iterator it = str.begin();; ) {
			szOut.Append("*.");
			szOut.Append((*it).c_str());

			if (++it == str.end()) {
				break;
			}
			szOut.Append(";");
		}
	}
    ASSIMP_END_EXCEPTION_REGION(void);
}